

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

void __thiscall OpenMD::SimInfo::calcNdfRaw(SimInfo *this)

{
  pointer ppSVar1;
  Molecule *pMVar2;
  pointer ppSVar3;
  StuntDouble *pSVar4;
  int iVar5;
  MoleculeIterator local_20;
  
  local_20._M_node = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar5 = 0;
  if ((_Rb_tree_header *)local_20._M_node == &(this->molecules_)._M_t._M_impl.super__Rb_tree_header)
  {
    pMVar2 = (Molecule *)0x0;
  }
  else {
    pMVar2 = (Molecule *)local_20._M_node[1]._M_parent;
  }
  while (pMVar2 != (Molecule *)0x0) {
    ppSVar3 = (pMVar2->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar1 = (pMVar2->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar3 != ppSVar1) goto LAB_00133e9b;
    pSVar4 = (StuntDouble *)0x0;
    while (pSVar4 != (StuntDouble *)0x0) {
      if (pSVar4->objType_ - otDAtom < 2) {
        if (pSVar4->linear_ == true) {
          iVar5 = iVar5 + 5;
        }
        else {
          iVar5 = iVar5 + 6;
        }
      }
      else {
        iVar5 = iVar5 + 3;
      }
      ppSVar3 = ppSVar3 + 1;
      pSVar4 = (StuntDouble *)0x0;
      if (ppSVar3 != ppSVar1) {
LAB_00133e9b:
        pSVar4 = *ppSVar3;
      }
    }
    pMVar2 = nextMolecule(this,&local_20);
  }
  this->ndfRaw_ = iVar5;
  return;
}

Assistant:

void SimInfo::calcNdfRaw() {
    int ndfRaw_local;

    MoleculeIterator i;
    vector<StuntDouble*>::iterator j;
    Molecule* mol;
    StuntDouble* sd;

    // Raw degrees of freedom that we have to set
    ndfRaw_local = 0;

    for (mol = beginMolecule(i); mol != NULL; mol = nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        ndfRaw_local += 3;

        if (sd->isDirectional()) {
          if (sd->isLinear()) {
            ndfRaw_local += 2;
          } else {
            ndfRaw_local += 3;
          }
        }
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(&ndfRaw_local, &ndfRaw_, 1, MPI_INT, MPI_SUM, MPI_COMM_WORLD);
#else
    ndfRaw_                    = ndfRaw_local;
#endif
  }